

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::expand
          (DArray<DP::SimpleCongruenceClosure::ConstInfo> *this,size_t s)

{
  ConstInfo *this_00;
  size_t sVar1;
  ConstInfo *__ptr;
  ConstInfo *pCVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->_capacity < s) {
    uVar3 = this->_capacity * 2;
    if (uVar3 <= s) {
      uVar3 = s;
    }
    pCVar2 = (ConstInfo *)Lib::alloc(uVar3 * 0xb8);
    sVar1 = this->_size;
    __ptr = this->_array;
    this->_capacity = uVar3;
    this->_array = pCVar2;
    for (lVar4 = 0; sVar1 * 0xb8 - lVar4 != 0; lVar4 = lVar4 + 0xb8) {
      this_00 = (ConstInfo *)((long)&__ptr->sigSymbol + lVar4);
      DP::SimpleCongruenceClosure::ConstInfo::ConstInfo
                ((ConstInfo *)((long)&pCVar2->sigSymbol + lVar4),this_00);
      DP::SimpleCongruenceClosure::ConstInfo::~ConstInfo(this_00);
    }
    pCVar2 = pCVar2 + sVar1;
    for (lVar4 = uVar3 * 0xb8 + sVar1 * -0xb8; lVar4 != 0; lVar4 = lVar4 + -0xb8) {
      memset(pCVar2,0,0xb0);
      (pCVar2->term)._content = 2;
      (pCVar2->namedPair).second = 0;
      (pCVar2->predecessorPremise).c1 = 0;
      (pCVar2->predecessorPremise).c2 = 0;
      (pCVar2->predecessorPremise).foOrigin = false;
      (pCVar2->predecessorPremise).foPremise = (Literal *)0x0;
      (pCVar2->classList)._capacity = 0;
      (pCVar2->classList)._stack = (uint *)0x0;
      (pCVar2->classList)._cursor = (uint *)0x0;
      (pCVar2->classList)._end = (uint *)0x0;
      (pCVar2->useList)._capacity = 0;
      (pCVar2->useList)._stack = (uint *)0x0;
      (pCVar2->useList)._cursor = (uint *)0x0;
      (pCVar2->useList)._end = (uint *)0x0;
      (pCVar2->upEdges)._capacity = 0;
      (pCVar2->upEdges)._stack = (uint *)0x0;
      (pCVar2->upEdges)._cursor = (uint *)0x0;
      (pCVar2->upEdges)._end = (uint *)0x0;
      (pCVar2->normalForm)._content = 2;
      pCVar2 = pCVar2 + 1;
    }
    this->_size = s;
    if (__ptr != (ConstInfo *)0x0) {
      Lib::free(__ptr);
      return;
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }